

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiKeyData * ImGui::GetKeyData(ImGuiKey key)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiKey in_EDI;
  int index;
  ImGuiContext *g;
  ImGuiKey local_18;
  ImGuiKey local_14;
  ImGuiKey local_4;
  
  pIVar1 = GImGui;
  local_4 = in_EDI;
  if ((in_EDI & ImGuiMod_Mask_) != ImGuiKey_KeysData_OFFSET) {
    local_4 = ConvertSingleModFlagToKey(in_EDI);
  }
  bVar2 = IsLegacyKey(local_4);
  if (bVar2) {
    if ((pIVar1->IO).KeyMap[(int)local_4] == -1) {
      local_18 = local_4;
    }
    else {
      local_18 = (pIVar1->IO).KeyMap[(int)local_4];
    }
    local_14 = local_18;
  }
  else {
    local_14 = local_4;
  }
  return (pIVar1->IO).KeysData + (int)local_14;
}

Assistant:

ImGuiKeyData* ImGui::GetKeyData(ImGuiKey key)
{
    ImGuiContext& g = *GImGui;

    // Special storage location for mods
    if (key & ImGuiMod_Mask_)
        key = ConvertSingleModFlagToKey(key);

    int index;
#ifndef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT(key >= ImGuiKey_LegacyNativeKey_BEGIN && key < ImGuiKey_NamedKey_END);
    if (IsLegacyKey(key))
        index = (g.IO.KeyMap[key] != -1) ? g.IO.KeyMap[key] : key; // Remap native->imgui or imgui->native
    else
        index = key;
#else
    IM_ASSERT(IsNamedKey(key) && "Support for user key indices was dropped in favor of ImGuiKey. Please update backend & user code.");
    index = key - ImGuiKey_NamedKey_BEGIN;
#endif
    return &g.IO.KeysData[index];
}